

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::anon_unknown_18::PrintByteSegmentInObjectTo
               (uchar *obj_bytes,size_t start,size_t count,ostream *os)

{
  ulong uVar1;
  ostream *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t j;
  size_t i;
  char text [5];
  long local_30;
  char local_25 [5];
  ostream *local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_25,0,5);
  for (local_30 = 0; local_30 != local_18; local_30 = local_30 + 1) {
    uVar1 = local_10 + local_30;
    if (local_30 != 0) {
      if ((uVar1 & 1) == 0) {
        std::operator<<(local_20,' ');
      }
      else {
        std::operator<<(local_20,'-');
      }
    }
    snprintf(local_25,5,"%02X",(ulong)*(byte *)(local_8 + uVar1));
    std::operator<<(local_20,local_25);
  }
  return;
}

Assistant:

void PrintByteSegmentInObjectTo(const unsigned char* obj_bytes, size_t start,
                                size_t count, ostream* os) {
  char text[5] = "";
  for (size_t i = 0; i != count; i++) {
    const size_t j = start + i;
    if (i != 0) {
      // Organizes the bytes into groups of 2 for easy parsing by
      // human.
      if ((j % 2) == 0)
        *os << ' ';
      else
        *os << '-';
    }
    GTEST_SNPRINTF_(text, sizeof(text), "%02X", obj_bytes[j]);
    *os << text;
  }
}